

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::invokeLambda<int,Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
          (anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  bool bVar1;
  BasicResult<Catch::clara::detail::ParseResultType> *in_RDI;
  ParserResult result;
  int temp;
  int *in_stack_00000180;
  string *in_stack_00000188;
  BasicResult<Catch::clara::detail::ParseResultType> *pBVar2;
  BasicResult<Catch::clara::detail::ParseResultType> *in_stack_ffffffffffffffa0;
  anon_class_8_1_50637480_for_m_lambda *in_stack_ffffffffffffffa8;
  BasicResult local_50 [52];
  undefined4 local_1c;
  
  local_1c = 0;
  pBVar2 = in_RDI;
  convertInto<int>(in_stack_00000188,in_stack_00000180);
  bVar1 = BasicResult::operator_cast_to_bool(local_50);
  if (bVar1) {
    LambdaInvoker<void>::invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__2,int>
              (in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
              (in_stack_ffffffffffffffa0,pBVar2);
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(in_RDI);
  return pBVar2;
}

Assistant:

inline auto invokeLambda( L const &lambda, std::string const &arg ) -> ParserResult {
        ArgType temp{};
        auto result = convertInto( arg, temp );
        return !result
           ? result
           : LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( lambda, temp );
    }